

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O2

void __thiscall QBlitterPaintEngine::drawRects(QBlitterPaintEngine *this,QRect *rects,int rectCount)

{
  QBlitterPaintEnginePrivate *this_00;
  QPaintEngineState *pQVar1;
  bool bVar2;
  QPaintEngineState *pQVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QRectF local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QBlitterPaintEnginePrivate *)
            (this->super_QRasterPaintEngine).super_QPaintEngineEx.super_QPaintEngine.d_ptr.d;
  bVar2 = CapabilitiesToStateMask::canBlitterDrawRectMask(&this_00->caps);
  if (bVar2) {
    if (rectCount < 1) {
      rectCount = 0;
    }
    uVar4 = (ulong)(uint)rectCount;
    while (bVar2 = uVar4 != 0, uVar4 = uVar4 - 1, bVar2) {
      QRectF::QRectF(&local_50,rects);
      pQVar1 = (this->super_QRasterPaintEngine).super_QPaintEngineEx.super_QPaintEngine.state;
      pQVar3 = pQVar1 + -2;
      if (pQVar1 == (QPaintEngineState *)0x0) {
        pQVar3 = (QPaintEngineState *)0x0;
      }
      QBlitterPaintEnginePrivate::fillRect
                (this_00,&local_50,(QColor *)(*(long *)(pQVar3 + 0x12) + 8),false);
      rects = rects + 1;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QRasterPaintEngine::drawRects(&this->super_QRasterPaintEngine,rects,rectCount);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBlitterPaintEngine::drawRects(const QRect *rects, int rectCount)
{
    Q_D(QBlitterPaintEngine);
    if (d->caps.canBlitterDrawRectMask()) {
        for (int i=0; i<rectCount; ++i)
            d->fillRect(rects[i], qbrush_color(state()->brush), false);
    } else {
        d->pmData->markRasterOverlay(rects, rectCount);
        QRasterPaintEngine::drawRects(rects, rectCount);
    }
}